

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTest.cpp
# Opt level: O0

void __thiscall FileTest::Test5(FileTest *this)

{
  uint uVar1;
  int res;
  int length;
  undefined8 local_2b0;
  char buffer [12];
  Selector s;
  File *local_28;
  File *pipe_files [2];
  FileTest *this_local;
  
  Selector::Selector((Selector *)(buffer + 8),(char *)0x0);
  local_2b0 = 0x6f57206f6c6c6548;
  builtin_strncpy(buffer,"rld",4);
  JetHead::File::pipe(&local_28);
  JetHead::File::setSelector((FileListener *)local_28,(Selector *)&this->super_FileListener);
  uVar1 = (**(code **)(*(long *)pipe_files[0] + 0x18))(pipe_files[0],&local_2b0,0xb);
  if (uVar1 != 0xb) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/FileTest.cpp"
               ,0x1fe,"Failed to write pipe %d",(ulong)uVar1);
  }
  Selector::~Selector((Selector *)(buffer + 8));
  return;
}

Assistant:

void FileTest::Test5()
{
	File *pipe_files[ 2 ];
	Selector s;
	const char buffer[] = "Hello World";
	
	File::pipe( pipe_files );
	
	pipe_files[ File::PIPE_READER ]->setSelector( (FileListener*)this, &s );

	int length = strlen( buffer );
	
	int res = pipe_files[ File::PIPE_WRITER ]->write( buffer, length );
	
	if ( res != length )
		TestFailed( "Failed to write pipe %d", res );
	
}